

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,StringPiece name)

{
  char cVar1;
  Tables *pTVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  char *str;
  long lVar6;
  char *pcVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __hash_code __code;
  char *pcVar10;
  StringPiece SVar11;
  string prefix;
  key_type local_98;
  Symbol local_90;
  string local_88;
  StringPiece local_68;
  string local_58;
  undefined7 uStack_57;
  pointer local_50;
  size_t local_48 [3];
  
  local_68.length_ = name.length_;
  local_68.ptr_ = name.ptr_;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_88,&local_68);
  lVar6 = std::__cxx11::string::rfind((char)&local_88,0x2e);
  if (lVar6 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_88);
      std::__cxx11::string::operator=((string *)&local_88,&local_58);
      if ((size_t *)CONCAT71(uStack_57,local_58) != local_48) {
        operator_delete((size_t *)CONCAT71(uStack_57,local_58));
      }
      sVar4 = local_88._M_string_length;
      _Var3._M_p = local_88._M_dataplus._M_p;
      pTVar2 = (this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
               _M_head_impl;
      if ((long)local_88._M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_88._M_string_length,"string length exceeds max size");
      }
      local_50 = _Var3._M_p;
      local_48[0] = sVar4;
      local_58 = (string)0xa;
      local_98.ptr_ = (SymbolBase *)&local_58;
      local_90.ptr_ = (SymbolBase *)&local_58;
      SVar11 = Symbol::full_name(&local_90);
      pcVar7 = SVar11.ptr_;
      if ((long)SVar11.length_ < 1) {
        __code = 0;
      }
      else {
        pcVar10 = pcVar7 + SVar11.length_;
        __code = 0;
        do {
          __code = (long)*pcVar7 + __code * 5;
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 < pcVar10);
      }
      p_Var8 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(pTVar2->symbols_by_name_)._M_h,
                          __code % *(size_type *)((long)&(pTVar2->symbols_by_name_)._M_h + 8),
                          &local_98,__code);
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      }
      else {
        p_Var9 = p_Var8->_M_nxt + 1;
        if (p_Var8->_M_nxt == (_Hash_node_base *)0x0) {
          p_Var9 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
        }
      }
      if (((p_Var9->_M_nxt != (_Hash_node_base *)0x0) &&
          (cVar1 = *(char *)&p_Var9->_M_nxt->_M_nxt, cVar1 != '\0')) && (cVar1 != '\t')) {
        bVar5 = true;
        goto LAB_00348137;
      }
      lVar6 = std::__cxx11::string::rfind((char)&local_88,0x2e);
    } while (lVar6 != -1);
  }
  if (this->underlay_ == (DescriptorPool *)0x0) {
    bVar5 = false;
  }
  else {
    SVar11.length_ = local_68.length_;
    SVar11.ptr_ = local_68.ptr_;
    bVar5 = IsSubSymbolOfBuiltType(this->underlay_,SVar11);
  }
LAB_00348137:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(StringPiece name) const {
  auto prefix = std::string(name);
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type() != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}